

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint16_t add16_sat(uint16_t a,uint16_t b)

{
  uint16_t uVar1;
  ushort uVar2;
  undefined2 in_register_0000003a;
  
  uVar2 = b + a;
  uVar1 = (short)(CONCAT22(in_register_0000003a,a) >> 0xf) + 0x7fff;
  if (-1 < (short)(uVar2 ^ a)) {
    uVar1 = uVar2;
  }
  if ((short)(b ^ a) < 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

static inline uint16_t add16_sat(uint16_t a, uint16_t b)
{
    uint16_t res;

    res = a + b;
    if (((res ^ a) & 0x8000) && !((a ^ b) & 0x8000)) {
        if (a & 0x8000)
            res = 0x8000;
        else
            res = 0x7fff;
    }
    return res;
}